

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

void sx__coro_wait(sx_coro_context *ctx,sx_fiber_t *pfrom,int msecs)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  sx_fiber_t pvVar3;
  
  if (ctx->cur_coro == (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x135,
                      "You must call this function from within sx_fiber_cb invoked by sx_fiber_invoke"
                     );
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  psVar1 = ctx->cur_coro;
  psVar1->ret_state = CORO_RET_WAIT;
  (psVar1->counter).tm = 0.0;
  (psVar1->arg).tm = (float)msecs * 0.001;
  ctx->cur_coro = (sx__coro_state *)0x0;
  pvVar3 = (sx_fiber_t)jump_fcontext(*pfrom,0);
  *pfrom = pvVar3;
  return;
}

Assistant:

void sx__coro_wait(sx_coro_context* ctx, sx_fiber_t* pfrom, int msecs)
{
    sx__coro_return(ctx, pfrom, CORO_RET_WAIT, msecs);
}